

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

Bigint * mult(Bigint *a,Bigint *b)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  Bigint *pBVar4;
  uint uVar5;
  ULong *pUVar6;
  Bigint *pBVar7;
  ULong *pUVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  pBVar7 = a;
  if (a->wds < b->wds) {
    pBVar7 = b;
    b = a;
  }
  iVar2 = pBVar7->wds;
  iVar3 = b->wds;
  uVar14 = (long)iVar3 + (long)iVar2;
  uVar12 = (uint)uVar14;
  pBVar4 = Balloc((uint)(pBVar7->maxwds < (int)uVar12) + pBVar7->k);
  pUVar6 = pBVar4->x;
  for (pUVar8 = pUVar6; pUVar8 < pBVar4->x + uVar14; pUVar8 = pUVar8 + 1) {
    *pUVar8 = 0;
  }
  for (pUVar8 = b->x; pUVar8 < b->x + iVar3; pUVar8 = pUVar8 + 1) {
    uVar5 = *pUVar8;
    if ((ulong)uVar5 != 0) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        puVar1 = (uint *)((long)pBVar7->x + lVar9);
        uVar11 = *(uint *)((long)pUVar6 + lVar9) + uVar10 + (ulong)*puVar1 * (ulong)uVar5;
        uVar10 = uVar11 >> 0x20;
        *(int *)((long)pUVar6 + lVar9) = (int)uVar11;
        lVar9 = lVar9 + 4;
      } while (puVar1 + 1 < pBVar7->x + iVar2);
      *(int *)((long)pUVar6 + lVar9) = (int)(uVar11 >> 0x20);
    }
    pUVar6 = pUVar6 + 1;
  }
  for (pUVar6 = pBVar4->x + (uVar14 - 1);
      (uVar13 = (uint)uVar14, uVar5 = (int)uVar12 >> 0x1f & uVar12, 0 < (int)uVar13 &&
      (uVar5 = uVar13, *pUVar6 == 0)); pUVar6 = pUVar6 + -1) {
    uVar14 = (ulong)(uVar13 - 1);
  }
  pBVar4->wds = uVar5;
  return pBVar4;
}

Assistant:

static Bigint *
mult(Bigint *a, Bigint *b MTd)
{
	Bigint *c;
	int k, wa, wb, wc;
	ULong *x, *xa, *xae, *xb, *xbe, *xc, *xc0;
	ULong y;
#ifdef ULLong
	ULLong carry, z;
#else
	ULong carry, z;
#ifdef Pack_32
	ULong z2;
#endif
#endif

	if (a->wds < b->wds) {
		c = a;
		a = b;
		b = c;
		}
	k = a->k;
	wa = a->wds;
	wb = b->wds;
	wc = wa + wb;
	if (wc > a->maxwds)
		k++;
	c = Balloc(k MTa);
	for(x = c->x, xa = x + wc; x < xa; x++)
		*x = 0;
	xa = a->x;
	xae = xa + wa;
	xb = b->x;
	xbe = xb + wb;
	xc0 = c->x;
#ifdef ULLong
	for(; xb < xbe; xc0++) {
		if ((y = *xb++)) {
			x = xa;
			xc = xc0;
			carry = 0;
			do {
				z = *x++ * (ULLong)y + *xc + carry;
				carry = z >> 32;
				*xc++ = z & FFFFFFFF;
				}
				while(x < xae);
			*xc = carry;
			}
		}
#else
#ifdef Pack_32
	for(; xb < xbe; xb++, xc0++) {
		if ((y = *xb & 0xffff)) {
			x = xa;
			xc = xc0;
			carry = 0;
			do {
				z = (*x & 0xffff) * y + (*xc & 0xffff) + carry;
				carry = z >> 16;
				z2 = (*x++ >> 16) * y + (*xc >> 16) + carry;
				carry = z2 >> 16;
				Storeinc(xc, z2, z);
				}
				while(x < xae);
			*xc = carry;
			}
		if ((y = *xb >> 16)) {
			x = xa;
			xc = xc0;
			carry = 0;
			z2 = *xc;
			do {
				z = (*x & 0xffff) * y + (*xc >> 16) + carry;
				carry = z >> 16;
				Storeinc(xc, z, z2);
				z2 = (*x++ >> 16) * y + (*xc & 0xffff) + carry;
				carry = z2 >> 16;
				}
				while(x < xae);
			*xc = z2;
			}
		}
#else
	for(; xb < xbe; xc0++) {
		if (y = *xb++) {
			x = xa;
			xc = xc0;
			carry = 0;
			do {
				z = *x++ * y + *xc + carry;
				carry = z >> 16;
				*xc++ = z & 0xffff;
				}
				while(x < xae);
			*xc = carry;
			}
		}
#endif
#endif
	for(xc0 = c->x, xc = xc0 + wc; wc > 0 && !*--xc; --wc) ;
	c->wds = wc;
	return c;
	}